

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtc.cc
# Opt level: O2

int main(int argc,char **argv)

{
  clock_t cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined7 uVar11;
  longlong lVar5;
  FILE *pFVar6;
  clock_t cVar7;
  clock_t cVar8;
  clock_t cVar9;
  clock_t cVar10;
  char *__format;
  code *pcVar12;
  char *pcVar13;
  int local_3ec;
  allocator<char> local_3e5;
  int local_3e4;
  code *local_3e0;
  code *local_3d8;
  char *local_3d0;
  ulong local_3c8;
  longlong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  allocator<char> local_3a0 [32];
  clock_t local_380;
  FILE *local_378;
  string arg;
  long local_350;
  check_manager checks;
  device_tree tree;
  
  local_3e4 = fileno(_stdout);
  local_380 = clock();
  dtc::fdt::device_tree::device_tree(&tree);
  dtc::fdt::checking::check_manager::check_manager(&checks);
  local_3e0 = (code *)0x0;
  local_3d8 = (code *)0x0;
  local_3c0 = 0;
  local_3b0 = 0;
  local_3c8 = 0;
  local_3a8 = 0;
  local_3b8 = 0;
  local_3d0 = "-";
  local_3ec = 0;
  pFVar6 = (FILE *)0x0;
switchD_0012a7f0_caseD_71:
  iVar4 = getopt(argc,argv,"@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:");
  if (0x17 < iVar4 - 0x40U) {
    uVar11 = (undefined7)
             ((ulong)((long)&switchD_0012a7f0::switchdataD_0013e5c8 +
                     (long)(int)(&switchD_0012a7f0::switchdataD_0013e5c8)[iVar4 - 0x62]) >> 8);
    switch(iVar4) {
    case 0x62:
      local_3c0 = strtoll(_optarg,(char **)0x0,10);
      local_3b0 = CONCAT71((int7)((ulong)local_3c0 >> 8),1);
      goto switchD_0012a7f0_caseD_71;
    case 99:
    case 0x65:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x72:
    case 0x74:
    case 0x75:
      goto switchD_0012a716_caseD_41;
    case 100:
      if (pFVar6 != (FILE *)0x0) {
        fclose(pFVar6);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
      bVar3 = std::operator==(&arg,"-");
      std::__cxx11::string::~string((string *)&arg);
      pFVar6 = _stdout;
      if (bVar3) goto switchD_0012a7f0_caseD_71;
      iVar4 = open(_optarg,0x241,0x1b6);
      pFVar6 = fdopen(iVar4,"w");
      if (pFVar6 != (FILE *)0x0) goto switchD_0012a7f0_caseD_71;
      pcVar13 = "Unable to open dependency file";
      break;
    case 0x66:
      local_3c8 = CONCAT71(uVar11,1);
      goto switchD_0012a7f0_caseD_71;
    case 0x68:
      std::__cxx11::string::string<std::allocator<char>>((string *)local_3a0,*argv,&local_3e5);
      pFVar6 = _stderr;
      dtc::__xpg_basename((dtc *)&arg,(char *)local_3a0);
      local_3ec = 0;
      fprintf(pFVar6,
              "Usage:\n\t%s\t[-fhsv@] [-b boot_cpu_id] [-d dependency_file][-E [no-]checker_name]\n\t\t[-H phandle_format] [-I input_format][-O output_format]\n\t\t[-o output_file] [-R entries] [-S bytes] [-p bytes][-V blob_version]\n\t\t-W [no-]checker_name] input_file\n"
              ,arg._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)local_3a0);
      goto LAB_0012b05c;
    case 0x69:
      dtc::fdt::device_tree::add_include_path(&tree,_optarg);
      goto switchD_0012a7f0_caseD_71;
    case 0x6f:
      local_3d0 = _optarg;
      if (((*_optarg == '-') && (_optarg[1] == '\0')) ||
         (local_3e4 = open(_optarg,0x241,0x1b6), local_3e4 != -1)) goto switchD_0012a7f0_caseD_71;
      pcVar13 = "Unable to open output file";
      break;
    case 0x70:
      lVar5 = strtoll(_optarg,(char **)0x0,10);
      tree.blob_padding = (uint32_t)lVar5;
    case 0x71:
      goto switchD_0012a7f0_caseD_71;
    case 0x73:
      local_3a8 = CONCAT71(uVar11,1);
      goto switchD_0012a7f0_caseD_71;
    case 0x76:
      local_3ec = 0;
      fprintf(_stdout,"Version: %s %d.%d.%d compatible with gpl dtc %d.%d.%d\n",*argv,0,5,0,1,4,7);
      goto LAB_0012b05c;
    default:
      if (iVar4 != -1) goto switchD_0012a716_caseD_41;
      pcVar12 = local_3d8;
      if (local_3d8 == (code *)0x0) {
        pcVar12 = dtc::fdt::device_tree::parse_dts;
      }
      if (local_3e0 == (code *)0x0) {
        local_3e0 = dtc::fdt::device_tree::write_binary;
      }
      if (_optind < argc) {
        pcVar13 = argv[_optind];
      }
      else {
        pcVar13 = "-";
      }
      if (pFVar6 != (FILE *)0x0) {
        fputs(local_3d0,pFVar6);
        fputs(": ",pFVar6);
        fputs(pcVar13,pFVar6);
      }
      cVar7 = clock();
      if (((ulong)pcVar12 & 1) != 0) {
        pcVar12 = *(code **)(pcVar12 + CONCAT44(tree._4_4_,tree.phandle_node_name) + -1);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&arg,pcVar13,local_3a0);
      (*pcVar12)(&tree,&arg,pFVar6);
      std::__cxx11::string::~string((string *)&arg);
      if ((local_3b0 & 1) != 0) {
        tree.boot_cpu = (uint32_t)local_3c0;
      }
      if ((local_3a8 & 1) != 0) {
        dtc::fdt::device_tree::sort(&tree);
      }
      if (pFVar6 != (FILE *)0x0) {
        putc(10,pFVar6);
        fclose(pFVar6);
      }
      if ((tree.valid == false) && ((local_3c8 & 1) == 0)) {
        fwrite("Failed to parse tree.\n",0x16,1,_stderr);
        goto switchD_0012a716_caseD_41;
      }
      cVar8 = clock();
      local_3ec = 1;
      bVar3 = dtc::fdt::checking::check_manager::run_checks(&checks,&tree,true);
      if ((bVar3) || ((local_3c8 & 1) != 0)) {
        cVar9 = clock();
        iVar4 = local_3e4;
        pcVar12 = local_3e0;
        if (((ulong)local_3e0 & 1) != 0) {
          pcVar12 = *(code **)(local_3e0 + CONCAT44(tree._4_4_,tree.phandle_node_name) + -1);
        }
        (*pcVar12)(&tree,local_3e4);
        close(iVar4);
        local_3ec = 0;
        cVar10 = clock();
        if ((local_3b8 & 1) != 0) {
          local_3ec = 0;
          getrusage(RUSAGE_SELF,(rusage *)&arg);
          fprintf(_stderr,"Peak memory usage: %ld bytes\n",local_350);
          cVar1 = local_380;
          fprintf(_stderr,"Setup and option parsing took %f seconds\n",
                  (double)(cVar7 - local_380) / 1000000.0);
          fprintf(_stderr,"Parsing took %f seconds\n",(double)(cVar8 - cVar7) / 1000000.0);
          fprintf(_stderr,"Checking took %f seconds\n",(double)(cVar9 - cVar8) / 1000000.0);
          fprintf(_stderr,"Generating output took %f seconds\n",(double)(cVar10 - cVar9) / 1000000.0
                 );
          fprintf(_stderr,"Total time: %f seconds\n",(double)(cVar10 - cVar1) / 1000000.0);
          fclose(_stdin);
        }
      }
      goto LAB_0012b05c;
    }
    perror(pcVar13);
    goto switchD_0012a716_caseD_41;
  }
  switch(iVar4) {
  case 0x40:
    tree.write_symbols = true;
    goto switchD_0012a7f0_caseD_71;
  default:
    goto switchD_0012a716_caseD_41;
  case 0x44:
    local_3b8 = CONCAT71((int7)((ulong)((long)&switchD_0012a716::switchdataD_0013e568 +
                                       (long)(int)(&switchD_0012a716::switchdataD_0013e568)
                                                  [iVar4 - 0x40U]) >> 8),1);
    goto switchD_0012a7f0_caseD_71;
  case 0x45:
  case 0x57:
    std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
    if ((((arg._M_string_length < 4) || (*_optarg != 'n')) || (_optarg[1] != 'o')) ||
       (_optarg[2] != '-')) {
      bVar3 = dtc::fdt::checking::check_manager::enable_checker(&checks,&arg);
      if (!bVar3) {
        __format = "Checker %s either does not exist or is already enabled\n";
        pcVar13 = _optarg;
        goto LAB_0012ac24;
      }
    }
    else {
      local_378 = pFVar6;
      std::__cxx11::string::string<std::allocator<char>>((string *)local_3a0,_optarg + 3,&local_3e5)
      ;
      std::__cxx11::string::operator=((string *)&arg,(string *)local_3a0);
      std::__cxx11::string::~string((string *)local_3a0);
      bVar3 = dtc::fdt::checking::check_manager::disable_checker(&checks,&arg);
      pFVar6 = local_378;
      if (!bVar3) {
        __format = "Checker %s either does not exist or is already disabled\n";
        pcVar13 = _optarg + 3;
LAB_0012ac24:
        fprintf(_stderr,__format,pcVar13);
      }
    }
    std::__cxx11::string::~string((string *)&arg);
    goto switchD_0012a7f0_caseD_71;
  case 0x48:
    std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
    bVar3 = std::operator==(&arg,"both");
    if (bVar3) {
      tree.phandle_node_name = BOTH;
    }
    else {
      bVar3 = std::operator==(&arg,"epapr");
      if (bVar3) {
        tree.phandle_node_name = EPAPR;
      }
      else {
        bVar3 = std::operator==(&arg,"linux");
        if (!bVar3) {
          pcVar13 = "Unknown phandle format: %s\n";
LAB_0012ac9f:
          bVar3 = false;
          fprintf(_stderr,pcVar13,_optarg);
          local_3ec = 1;
          break;
        }
        tree.phandle_node_name = LINUX;
      }
    }
    bVar3 = true;
    break;
  case 0x49:
    std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
    bVar3 = std::operator==(&arg,"dtb");
    if (bVar3) {
      if (local_3e0 == (code *)0x0) {
        local_3e0 = dtc::fdt::device_tree::write_dts;
      }
      local_3d8 = dtc::fdt::device_tree::parse_dtb;
    }
    else {
      bVar3 = std::operator==(&arg,"dts");
      if (!bVar3) {
        bVar3 = false;
        fprintf(_stderr,"Unknown input format: %s\n",_optarg);
        local_3ec = 1;
        break;
      }
      local_3d8 = dtc::fdt::device_tree::parse_dts;
    }
    bVar3 = true;
    break;
  case 0x4f:
    std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
    bVar2 = std::operator==(&arg,"dtb");
    bVar3 = true;
    if (bVar2) {
      local_3e0 = dtc::fdt::device_tree::write_binary;
    }
    else {
      bVar2 = std::operator==(&arg,"asm");
      if (bVar2) {
        local_3e0 = dtc::fdt::device_tree::write_asm;
      }
      else {
        bVar2 = std::operator==(&arg,"dts");
        if (!bVar2) {
          pcVar13 = "Unknown output format: %s\n";
          goto LAB_0012ac9f;
        }
        if (local_3d8 == (code *)0x0) {
          local_3d8 = dtc::fdt::device_tree::parse_dtb;
        }
        local_3e0 = dtc::fdt::device_tree::write_dts;
      }
    }
    break;
  case 0x50:
    bVar3 = dtc::fdt::device_tree::parse_define(&tree,_optarg);
    if (!bVar3) {
      fprintf(_stderr,"Invalid predefine value %s\n",_optarg);
    }
    goto switchD_0012a7f0_caseD_71;
  case 0x52:
    lVar5 = strtoll(_optarg,(char **)0x0,10);
    tree.spare_reserve_map_entries = (uint32_t)lVar5;
    goto switchD_0012a7f0_caseD_71;
  case 0x53:
    lVar5 = strtoll(_optarg,(char **)0x0,10);
    tree.minimum_blob_size = (uint32_t)lVar5;
    goto switchD_0012a7f0_caseD_71;
  case 0x56:
    goto switchD_0012a716_caseD_56;
  }
  std::__cxx11::string::~string((string *)&arg);
  if (!bVar3) goto LAB_0012b05c;
  goto switchD_0012a7f0_caseD_71;
switchD_0012a716_caseD_56:
  std::__cxx11::string::string<std::allocator<char>>((string *)&arg,_optarg,local_3a0);
  bVar3 = std::operator!=(&arg,"17");
  std::__cxx11::string::~string((string *)&arg);
  if (bVar3) {
    fprintf(_stderr,"Unknown output format version: %s\n",_optarg);
switchD_0012a716_caseD_41:
    local_3ec = 1;
LAB_0012b05c:
    dtc::fdt::checking::check_manager::~check_manager(&checks);
    dtc::fdt::device_tree::~device_tree(&tree);
    return local_3ec;
  }
  goto switchD_0012a7f0_caseD_71;
}

Assistant:

int
main(int argc, char **argv)
{
	int ch;
	int outfile = fileno(stdout);
	const char *outfile_name = "-";
	const char *in_file = "-";
	FILE *depfile = 0;
	bool debug_mode = false;
	tree_write_fn_ptr write_fn = nullptr;
	tree_read_fn_ptr read_fn = nullptr;
	uint32_t boot_cpu = 0;
	bool boot_cpu_specified = false;
	bool keep_going = false;
	bool sort = false;
	clock_t c0 = clock();
	class device_tree tree;
	fdt::checking::check_manager checks;
	const char *options = "@hqI:O:o:V:d:R:S:p:b:fi:svH:W:E:DP:";

	// Don't forget to update the man page if any more options are added.
	while ((ch = getopt(argc, argv, options)) != -1)
	{
		switch (ch)
		{
		case 'h':
			usage(argv[0]);
			return EXIT_SUCCESS;
		case 'v':
			version(argv[0]);
			return EXIT_SUCCESS;
		case '@':
			tree.write_symbols = true;
			break;
		case 'I':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				read_fn = &device_tree::parse_dtb;
				if (write_fn == nullptr)
				{
					write_fn = &device_tree::write_dts;
				}
			}
			else if (arg == "dts")
			{
				read_fn = &device_tree::parse_dts;
			}
			else
			{
				fprintf(stderr, "Unknown input format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'O':
		{
			string arg(optarg);
			if (arg == "dtb")
			{
				write_fn = &device_tree::write_binary;
			}
			else if (arg == "asm")
			{
				write_fn = &device_tree::write_asm;
			}
			else if (arg == "dts")
			{
				write_fn = &device_tree::write_dts;
				if (read_fn == nullptr)
				{
					read_fn = &device_tree::parse_dtb;
				}
			}
			else
			{
				fprintf(stderr, "Unknown output format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'o':
		{
			outfile_name = optarg;
			if (strcmp(outfile_name, "-") != 0)
			{
				outfile = open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666);
				if (outfile == -1)
				{
					perror("Unable to open output file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'D':
			debug_mode = true;
			break;
		case 'V':
			if (string(optarg) != "17")
			{
				fprintf(stderr, "Unknown output format version: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		case 'd':
		{
			if (depfile != 0)
			{
				fclose(depfile);
			}
			if (string(optarg) == "-")
			{
				depfile = stdout;
			}
			else
			{
				depfile = fdopen(open(optarg, O_CREAT | O_TRUNC | O_WRONLY, 0666), "w");
				if (depfile == 0)
				{
					perror("Unable to open dependency file");
					return EXIT_FAILURE;
				}
			}
			break;
		}
		case 'H':
		{
			string arg(optarg);
			if (arg == "both")
			{
				tree.set_phandle_format(device_tree::BOTH);
			}
			else if (arg == "epapr")
			{
				tree.set_phandle_format(device_tree::EPAPR);
			}
			else if (arg == "linux")
			{
				tree.set_phandle_format(device_tree::LINUX);
			}
			else
			{
				fprintf(stderr, "Unknown phandle format: %s\n", optarg);
				return EXIT_FAILURE;
			}
			break;
		}
		case 'b':
			// Don't bother to check if strtoll fails, just
			// use the 0 it returns.
			boot_cpu = (uint32_t)strtoll(optarg, 0, 10);
			boot_cpu_specified = true;
			break;
		case 'f':
			keep_going = true;
			break;
		case 'W':
		case 'E':
		{
			string arg(optarg);
			if ((arg.size() > 3) && (strncmp(optarg, "no-", 3) == 0))
			{
				arg = string(optarg+3);
				if (!checks.disable_checker(arg))
				{
					fprintf(stderr, "Checker %s either does not exist or is already disabled\n", optarg+3);
				}
				break;
			}
			if (!checks.enable_checker(arg))
			{
				fprintf(stderr, "Checker %s either does not exist or is already enabled\n", optarg);
			}
			break;
		}
		case 's':
		{
			sort = true;
			break;
		}
		case 'i':
		{
			tree.add_include_path(optarg);
			break;
		}
		// Should quiet warnings, but for now is silently ignored.
		case 'q':
			break;
		case 'R':
			tree.set_empty_reserve_map_entries(strtoll(optarg, 0, 10));
			break;
		case 'S':
			tree.set_blob_minimum_size(strtoll(optarg, 0, 10));
			break;
		case 'p':
			tree.set_blob_padding(strtoll(optarg, 0, 10));
			break;
		case 'P':
			if (!tree.parse_define(optarg))
			{
				fprintf(stderr, "Invalid predefine value %s\n",
				        optarg);
			}
			break;
		default:
			/* 
			 * Since opterr is non-zero, getopt will have
			 * already printed an error message.
			 */
			return EXIT_FAILURE;
		}
	}
	if (read_fn == nullptr)
	{
		read_fn = &device_tree::parse_dts;
	}
	if (write_fn == nullptr)
	{
		write_fn = &device_tree::write_binary;
	}
	if (optind < argc)
	{
		in_file = argv[optind];
	}
	if (depfile != 0)
	{
		fputs(outfile_name, depfile);
		fputs(": ", depfile);
		fputs(in_file, depfile);
	}
	clock_t c1 = clock();
	(tree.*read_fn)(in_file, depfile);
	// Override the boot CPU found in the header, if we're loading from dtb
	if (boot_cpu_specified)
	{
		tree.set_boot_cpu(boot_cpu);
	}
	if (sort)
	{
		tree.sort();
	}
	if (depfile != 0)
	{
		putc('\n', depfile);
		fclose(depfile);
	}
	if (!(tree.is_valid() || keep_going))
	{
		fprintf(stderr, "Failed to parse tree.\n");
		return EXIT_FAILURE;
	}
	clock_t c2 = clock();
	if (!(checks.run_checks(&tree, true) || keep_going))
	{
		return EXIT_FAILURE;
	}
	clock_t c3 = clock();
	(tree.*write_fn)(outfile);
	close(outfile);
	clock_t c4 = clock();

	if (debug_mode)
	{
		struct rusage r;

		getrusage(RUSAGE_SELF, &r);
		fprintf(stderr, "Peak memory usage: %ld bytes\n", r.ru_maxrss);
		fprintf(stderr, "Setup and option parsing took %f seconds\n",
				((double)(c1-c0))/CLOCKS_PER_SEC);
		fprintf(stderr, "Parsing took %f seconds\n",
				((double)(c2-c1))/CLOCKS_PER_SEC);
		fprintf(stderr, "Checking took %f seconds\n",
				((double)(c3-c2))/CLOCKS_PER_SEC);
		fprintf(stderr, "Generating output took %f seconds\n",
				((double)(c4-c3))/CLOCKS_PER_SEC);
		fprintf(stderr, "Total time: %f seconds\n",
				((double)(c4-c0))/CLOCKS_PER_SEC);
		// This is not needed, but keeps valgrind quiet.
		fclose(stdin);
	}
	return EXIT_SUCCESS;
}